

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int parse_record_header(st_ptls_record_t *rec,uint8_t *src)

{
  uint16_t uVar1;
  int iVar2;
  uint8_t *src_local;
  st_ptls_record_t *rec_local;
  
  rec->type = *src;
  uVar1 = ntoh16(src + 1);
  rec->version = uVar1;
  uVar1 = ntoh16(src + 3);
  rec->length = (ulong)uVar1;
  iVar2 = 0x4000;
  if (rec->type == '\x17') {
    iVar2 = 0x4100;
  }
  if ((ulong)(long)iVar2 < rec->length) {
    rec_local._4_4_ = 0x32;
  }
  else {
    rec_local._4_4_ = 0;
  }
  return rec_local._4_4_;
}

Assistant:

static int parse_record_header(struct st_ptls_record_t *rec, const uint8_t *src)
{
    rec->type = src[0];
    rec->version = ntoh16(src + 1);
    rec->length = ntoh16(src + 3);

    if (rec->length >
        (size_t)(rec->type == PTLS_CONTENT_TYPE_APPDATA ? PTLS_MAX_ENCRYPTED_RECORD_SIZE : PTLS_MAX_PLAINTEXT_RECORD_SIZE))
        return PTLS_ALERT_DECODE_ERROR;

    return 0;
}